

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteAmbienttLight(ColladaExporter *this,aiLight *light)

{
  ostream *poVar1;
  aiColor3D *color;
  aiLight *light_local;
  ColladaExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<ambient>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<color sid=\"color\">");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorAmbient).r);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorAmbient).g);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorAmbient).b);
  poVar1 = std::operator<<(poVar1,"</color>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</ambient>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteAmbienttLight(const aiLight *const light){

    const aiColor3D &color=  light->mColorAmbient;
    mOutput << startstr << "<ambient>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;

    PopTag();
    mOutput << startstr << "</ambient>" << endstr;
}